

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O1

Ref __thiscall trun::TestRunner::CreateTestFunc(TestRunner *this,string *symbol)

{
  long lVar1;
  ILogger *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar2;
  ILogger *pIVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar4;
  Ref RVar5;
  string testCase;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  funcparts;
  undefined1 local_88 [32];
  undefined1 local_68 [40];
  size_type sStack_40;
  undefined8 local_38;
  
  local_68._32_8_ = (pointer)0x0;
  sStack_40 = 0;
  local_38 = 0;
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_68 + 0x20),(symbol->_M_dataplus)._M_p,0x5f);
  lVar1 = (long)(sStack_40 - local_68._32_8_) >> 5;
  if (lVar1 == 3) {
    TestFunc::Create((TestFunc *)local_88,symbol,(string *)(local_68._32_8_ + 0x20),
                     (string *)(local_68._32_8_ + 0x40));
    peVar4 = (element_type *)local_88._8_8_;
    pIVar3 = (ILogger *)local_88._0_8_;
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (element_type *)0x0;
  }
  else if (lVar1 == 2) {
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"-","");
    TestFunc::Create((TestFunc *)local_68,symbol,(string *)local_88,
                     (string *)(local_68._32_8_ + 0x20));
    peVar4 = (element_type *)local_68._8_8_;
    pIVar3 = (ILogger *)local_68._0_8_;
    local_68._8_8_ = (element_type *)0x0;
    local_68._0_8_ = (ILogger *)0x0;
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
LAB_00129ad4:
      local_68._8_8_ = (element_type *)0x0;
      local_68._0_8_ = (ILogger *)0x0;
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  else {
    if (lVar1 == 1) {
      local_88._0_8_ = local_88 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"TestRunner","");
      this_00 = gnilk::Logger::GetLogger((string *)local_88);
      gnilk::Log::Warning<char_const*,char_const*>
                (this_00,
                 "Bare test function: \'%s\' (skipping), consider renaming: (test_<library>_<case>)"
                 ,(symbol->_M_dataplus)._M_p);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      this->pLogger = (ILogger *)0x0;
      (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_00129ae8;
    }
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
    if (0x40 < sStack_40 - local_68._32_8_) {
      uVar2 = 2;
      lVar1 = 0x48;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   *(char **)(local_68._32_8_ + lVar1 + -8),*(size_type *)(local_68._32_8_ + lVar1))
        ;
        if (uVar2 < ((long)(sStack_40 - local_68._32_8_) >> 5) - 1U) {
          local_68._0_8_ = (ILogger *)(local_68 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"_","");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (char *)local_68._0_8_,local_68._8_8_);
          if ((ILogger *)local_68._0_8_ != (ILogger *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x20;
      } while (uVar2 < (ulong)((long)(sStack_40 - local_68._32_8_) >> 5));
    }
    TestFunc::Create((TestFunc *)local_68,symbol,(string *)(local_68._32_8_ + 0x20),
                     (string *)local_88);
    peVar4 = (element_type *)local_68._8_8_;
    pIVar3 = (ILogger *)local_68._0_8_;
    local_68._8_8_ = (element_type *)0x0;
    local_68._0_8_ = (ILogger *)0x0;
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) goto LAB_00129ad4;
  }
  this->pLogger = pIVar3;
  (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
LAB_00129ae8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_68 + 0x20));
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ref)RVar5.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestFunc::Ref TestRunner::CreateTestFunc(const std::string &symbol) {
    TestFunc::Ref func = nullptr;

    std::vector<std::string> funcparts;
    trun::split(funcparts, symbol.c_str(), '_');

    if (funcparts.size() == 1) {
        gnilk::Logger::GetLogger("TestRunner")->Warning("Bare test function: '%s' (skipping), consider renaming: (test_<library>_<case>)", symbol.c_str());
        return nullptr;
    } else if (funcparts.size() == 2) {
        func = TestFunc::Create(symbol,"-", funcparts[1]);
    } else if (funcparts.size() == 3) {
        func = TestFunc::Create(symbol, funcparts[1], funcparts[2]);
    } else {
        // merge '3' and onwards
        std::string testCase = "";
        for(size_t i=2;i<funcparts.size();i++) {
            testCase += funcparts[i];
            if (i<(funcparts.size()-1)) {
                testCase += std::string("_");
            }
        }
        func = TestFunc::Create(symbol, funcparts[1], testCase);
    }

    return func;
}